

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O2

void Rwt_Man4ExplorePrint(void)

{
  int *piVar1;
  size_t __size;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  void *__ptr;
  uint *__ptr_00;
  FILE *__stream;
  Rwr_Man4_t *pRVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint *Sign;
  undefined8 uStack_38;
  
  uVar9 = 0;
  uVar7 = 0;
  uVar8 = 0;
  for (lVar6 = 0; lVar6 < s_pManRwrExp4->nFuncs; lVar6 = lVar6 + 1) {
    uVar2 = s_pManRwrExp4->pnCounts[lVar6];
    if ((int)uVar9 <= (int)uVar2) {
      uVar9 = uVar2;
    }
    uVar7 = (ulong)((int)uVar7 + uVar2);
    uVar8 = uVar8 + (0 < (int)uVar2);
  }
  uStack_38 = in_RAX;
  printf("Number of cuts considered       = %8d.\n",uVar7);
  printf("Classes occurring at least once = %8d.\n",(ulong)uVar8);
  __size = (ulong)uVar9 * 4 + 4;
  uVar7 = 1;
  __ptr = calloc(1,__size);
  __ptr_00 = (uint *)malloc(__size);
  pRVar4 = s_pManRwrExp4;
  iVar5 = s_pManRwrExp4->nFuncs;
  for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
    iVar3 = pRVar4->pnCounts[lVar6];
    piVar1 = (int *)((long)__ptr + (long)iVar3 * 4);
    *piVar1 = *piVar1 + 1;
    __ptr_00[iVar3] = (uint)lVar6;
  }
  printf("Occurence = %6d.  Num classes = %4d.  \n",0,(ulong)(0x8f0 - uVar8));
  uVar10 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)uVar9;
  }
  Sign = __ptr_00;
  for (; Sign = Sign + 1, uVar7 - uVar10 != 1; uVar7 = uVar7 + 1) {
    if (*(int *)((long)__ptr + uVar7 * 4) != 0) {
      printf("Occurence = %6d.  Num classes = %4d.  Repr = ",uVar7 & 0xffffffff);
      Extra_PrintBinary(_stdout,Sign,0x10);
      putchar(10);
    }
  }
  free(__ptr);
  free(__ptr_00);
  __stream = fopen("npnclass_stats4.txt","w");
  uVar9 = 0;
  pRVar4 = s_pManRwrExp4;
  for (iVar5 = 0; uStack_38 = CONCAT44(iVar5,(undefined4)uStack_38), iVar5 < pRVar4->nFuncs;
      iVar5 = iVar5 + 1) {
    if (0 < pRVar4->pnCounts[iVar5]) {
      Extra_PrintHex((FILE *)__stream,(uint *)((long)&uStack_38 + 4),4);
      fprintf(__stream," %10d\n",(ulong)(uint)s_pManRwrExp4->pnCounts[uStack_38._4_4_]);
      uVar9 = uVar9 + 1;
      pRVar4 = s_pManRwrExp4;
      iVar5 = uStack_38._4_4_;
    }
  }
  fclose(__stream);
  printf("%d classes written into file \"%s\".\n",(ulong)uVar9,"npnclass_stats4.txt");
  return;
}

Assistant:

void Rwt_Man4ExplorePrint()
{
    FILE * pFile;
    int i, CountMax, CountWrite, nCuts, nClasses;
    int * pDistrib;
    int * pReprs;
    // find the max number of occurences
    nCuts = nClasses = 0;
    CountMax = 0;
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        if ( CountMax < s_pManRwrExp4->pnCounts[i] )
            CountMax = s_pManRwrExp4->pnCounts[i];
        nCuts += s_pManRwrExp4->pnCounts[i];
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
            nClasses++;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", nClasses );
    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( int, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        pDistrib[ s_pManRwrExp4->pnCounts[i] ]++;
        pReprs[ s_pManRwrExp4->pnCounts[i] ] = i;
    }

    printf( "Occurence = %6d.  Num classes = %4d.  \n", 0, 2288-nClasses );
    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, (unsigned*)&(pReprs[i]), 16 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );
    // write into a file all classes above limit (5)
    CountWrite = 0;
    pFile = fopen( "npnclass_stats4.txt", "w" );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
        {
            Extra_PrintHex( pFile, (unsigned *)&i, 4 );
            fprintf( pFile, " %10d\n", s_pManRwrExp4->pnCounts[i] );
//            fprintf( pFile, "%d ", i );
            CountWrite++;
        }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", CountWrite, "npnclass_stats4.txt" );
}